

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

int __thiscall doctest::Context::run(Context *this)

{
  int iVar1;
  TestData *pTVar2;
  char *pcVar3;
  TestData *pTVar4;
  pointer ppTVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ContextState *pCVar9;
  ContextState *pCVar10;
  size_type sVar11;
  code *__compar;
  detail *this_00;
  Color *pCVar12;
  char *pcVar13;
  Color *pCVar14;
  pointer ppTVar15;
  long lVar16;
  ulong uVar17;
  Color col_6;
  uint local_520;
  uint local_51c;
  vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
  testArray;
  undefined1 local_4f8 [24];
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilters;
  undefined1 local_4b0 [48];
  undefined1 local_480 [48];
  undefined1 local_450 [24];
  Color col;
  undefined4 uStack_434;
  
  pCVar10 = this->p;
  detail::getContextState::data = pCVar10;
  pCVar10->numAssertions = 0;
  pCVar10->numFailedAssertions = 0;
  if (((pCVar10->no_run != false) || ((pCVar10->version & 1U) != 0)) || (pCVar10->help == true)) {
    this_00 = (detail *)this;
    if ((pCVar10->version & 1U) != 0) {
      detail::printVersion((detail *)this);
      pCVar10 = this->p;
    }
    if (pCVar10->help == true) {
      detail::printHelp(this_00);
    }
    detail::getContextState::data = (ContextState *)0x0;
    return 0;
  }
  pCVar12 = (Color *)this;
  detail::printVersion((detail *)this);
  detail::Color::use(pCVar12,Cyan);
  printf("%s");
  detail::Color::~Color(&col);
  pcVar13 = "run with \"--help\" for options";
  puts("run with \"--help\" for options");
  detail::getRegisteredTests();
  testArray.
  super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  testArray.
  super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testArray.
  super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar10 = (ContextState *)
            detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pCVar9 = (ContextState *)
                  testArray.
                  super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pCVar10 !=
        (ContextState *)&detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    _col = (ContextState *)
           &(pCVar10->filters).
            super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    std::vector<doctest::detail::TestData_const*,std::allocator<doctest::detail::TestData_const*>>::
    emplace_back<doctest::detail::TestData_const*>
              ((vector<doctest::detail::TestData_const*,std::allocator<doctest::detail::TestData_const*>>
                *)&testArray,(TestData **)&col);
    pCVar9 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar10);
    pcVar13 = (char *)pCVar10;
    pCVar10 = pCVar9;
  }
  lVar16 = (long)testArray.
                 super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)testArray.
                 super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar16 != 0) {
    pCVar10 = this->p;
    pcVar13 = (pCVar10->order_by).m_str;
    iVar6 = detail::stricmp(pcVar13,"file");
    if (iVar6 == 0) {
      __compar = detail::fileOrderComparator;
    }
    else {
      iVar6 = detail::stricmp(pcVar13,"suite");
      if (iVar6 == 0) {
        __compar = detail::suiteOrderComparator;
      }
      else {
        iVar6 = detail::stricmp(pcVar13,"name");
        if (iVar6 != 0) {
          iVar6 = detail::stricmp(pcVar13,"rand");
          if (iVar6 == 0) {
            uVar7 = pCVar10->rand_seed;
            pcVar13 = (char *)(ulong)uVar7;
            srand(uVar7);
            ppTVar5 = testArray.
                      super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar17 = (ulong)((long)testArray.
                                   super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)testArray.
                                  super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3;
            ppTVar15 = testArray.
                       super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + ((int)uVar17 - 1);
            for (; (int)uVar17 != 1; uVar17 = (ulong)((int)uVar17 - 1)) {
              uVar7 = rand();
              pTVar2 = *ppTVar15;
              iVar6 = (int)((ulong)uVar7 % (uVar17 & 0xffffffff));
              *ppTVar15 = ppTVar5[iVar6];
              ppTVar5[iVar6] = pTVar2;
              ppTVar15 = ppTVar15 + -1;
            }
          }
          goto LAB_00107d38;
        }
        __compar = detail::nameOrderComparator;
      }
    }
    qsort(pCVar9,lVar16 >> 3,8,__compar);
    pcVar13 = (char *)pCVar9;
  }
LAB_00107d38:
  pCVar10 = this->p;
  if (pCVar10->list_test_cases == true) {
    detail::Color::use((Color *)pcVar13,Cyan);
    printf("%s");
    detail::Color::~Color(&col);
    pcVar13 = "listing all test case names";
    puts("listing all test case names");
    pCVar10 = this->p;
  }
  testSuitesPassingFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &testSuitesPassingFilters._M_t._M_impl.super__Rb_tree_header._M_header;
  testSuitesPassingFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  testSuitesPassingFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  testSuitesPassingFilters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  testSuitesPassingFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       testSuitesPassingFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pCVar10->list_test_suites == true) {
    detail::Color::use((Color *)pcVar13,Cyan);
    printf("%s");
    detail::Color::~Color(&col);
    pcVar13 = "listing all test suites";
    puts("listing all test suites");
  }
  uVar7 = 0;
  local_520 = 0;
  local_51c = 0;
  while( true ) {
    pCVar10 = (ContextState *)local_4f8;
    if ((ulong)((long)testArray.
                      super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)testArray.
                      super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar7) break;
    pTVar2 = testArray.
             super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar7];
    pcVar13 = pTVar2->m_file;
    std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
              ((vector<doctest::String,_std::allocator<doctest::String>_> *)pCVar10,
               (this->p->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    iVar6 = detail::matchesAny(pcVar13,(vector<doctest::String,_std::allocator<doctest::String>_> *)
                                       pCVar10,1,this->p->case_sensitive);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
              ((vector<doctest::String,_std::allocator<doctest::String>_> *)pCVar10);
    pcVar13 = (char *)pCVar10;
    if (iVar6 != 0) {
      pcVar13 = pTVar2->m_file;
      std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_450,
                 (this->p->filters).
                 super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
      iVar6 = detail::matchesAny(pcVar13,(vector<doctest::String,_std::allocator<doctest::String>_>
                                          *)local_450,0,this->p->case_sensitive);
      pcVar13 = (char *)local_450;
      std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_450);
      if (iVar6 == 0) {
        pcVar3 = pTVar2->m_suite;
        std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                  ((vector<doctest::String,_std::allocator<doctest::String>_> *)(local_480 + 0x18),
                   (this->p->filters).
                   super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2);
        pcVar13 = local_480 + 0x18;
        iVar6 = detail::matchesAny(pcVar3,(vector<doctest::String,_std::allocator<doctest::String>_>
                                           *)pcVar13,1,this->p->case_sensitive);
        std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                  ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar13);
        if (iVar6 != 0) {
          pcVar3 = pTVar2->m_suite;
          std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                    ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_480,
                     (this->p->filters).
                     super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 3);
          pcVar13 = local_480;
          iVar6 = detail::matchesAny(pcVar3,(vector<doctest::String,_std::allocator<doctest::String>_>
                                             *)pcVar13,0,this->p->case_sensitive);
          std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                    ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar13);
          if (iVar6 == 0) {
            pcVar3 = pTVar2->m_name;
            std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                      ((vector<doctest::String,_std::allocator<doctest::String>_> *)
                       (local_4b0 + 0x18),
                       (this->p->filters).
                       super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
            pcVar13 = local_4b0 + 0x18;
            iVar6 = detail::matchesAny(pcVar3,(vector<doctest::String,_std::allocator<doctest::String>_>
                                               *)pcVar13,1,this->p->case_sensitive);
            std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                      ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar13);
            if (iVar6 != 0) {
              pcVar3 = pTVar2->m_name;
              std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                        ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_4b0,
                         (this->p->filters).
                         super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 5);
              pcVar13 = local_4b0;
              iVar6 = detail::matchesAny(pcVar3,(vector<doctest::String,_std::allocator<doctest::String>_>
                                                 *)pcVar13,0,this->p->case_sensitive);
              std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                        ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar13);
              if (iVar6 == 0) {
                local_520 = local_520 + 1;
                pcVar13 = (char *)this->p;
                if (((ContextState *)pcVar13)->count == false) {
                  if (((ContextState *)pcVar13)->list_test_cases == true) {
                    pcVar13 = pTVar2->m_name;
                    puts(pcVar13);
                  }
                  else if (((ContextState *)pcVar13)->list_test_suites == true) {
                    String::String((String *)&col,pTVar2->m_suite);
                    sVar11 = std::
                             set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                             ::count(&testSuitesPassingFilters,(key_type *)&col);
                    pcVar13 = (char *)_col;
                    free(_col);
                    if (sVar11 == 0) {
                      puts(pTVar2->m_suite);
                      String::String((String *)&col,pTVar2->m_suite);
                      std::
                      _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                      ::_M_insert_unique<doctest::String>
                                (&testSuitesPassingFilters._M_t,(String *)&col);
                      pcVar13 = (char *)_col;
                      free(_col);
                    }
                  }
                  else if (((ContextState *)pcVar13)->first <= local_520 &&
                           (((ContextState *)pcVar13)->last < ((ContextState *)pcVar13)->first ||
                           local_520 <= ((ContextState *)pcVar13)->last)) {
                    (((ContextState *)pcVar13)->super_TestAccessibleContextState).currentTest =
                         pTVar2;
                    (((ContextState *)pcVar13)->super_TestAccessibleContextState).
                    hasLoggedCurrentTestStart = false;
                    if ((*(char *)&(((_Vector_impl *)
                                    &(((ContextState *)pcVar13)->super_TestAccessibleContextState).
                                     success)->super__Vector_impl_data)._M_start == '\x01') &&
                       ((detail::getContextState::data->super_TestAccessibleContextState).
                        hasLoggedCurrentTestStart == false)) {
                      pTVar4 = (detail::getContextState::data->super_TestAccessibleContextState).
                               currentTest;
                      detail::logTestStart(pTVar4->m_name,pTVar4->m_file,pTVar4->m_line);
                      (detail::getContextState::data->super_TestAccessibleContextState).
                      hasLoggedCurrentTestStart = true;
                      pcVar13 = (char *)this->p;
                    }
                    std::
                    _Rb_tree<doctest::detail::SubcaseSignature,_doctest::detail::SubcaseSignature,_std::_Identity<doctest::detail::SubcaseSignature>,_std::less<doctest::detail::SubcaseSignature>,_std::allocator<doctest::detail::SubcaseSignature>_>
                    ::clear(&(((ContextState *)pcVar13)->subcasesPassed)._M_t);
                    pcVar13 = (char *)this->p;
                    iVar6 = 0;
                    do {
                      (((ContextState *)pcVar13)->super_TestAccessibleContextState).
                      numAssertionsForCurrentTestcase = 0;
                      ((ContextState *)pcVar13)->numFailedAssertionsForCurrentTestcase = 0;
                      ((ContextState *)pcVar13)->subcasesHasSkipped = false;
                      ((ContextState *)pcVar13)->subcasesCurrentLevel = 0;
                      std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::clear(&(((ContextState *)pcVar13)->subcasesEnteredLevels)._M_t);
                      iVar8 = detail::callTestFunc(pTVar2->m_f);
                      pcVar13 = (char *)this->p;
                      iVar1 = ((ContextState *)pcVar13)->abort_after;
                      ((ContextState *)pcVar13)->numAssertions =
                           ((ContextState *)pcVar13)->numAssertions +
                           (((ContextState *)pcVar13)->super_TestAccessibleContextState).
                           numAssertionsForCurrentTestcase;
                      if ((0 < iVar1) && (iVar1 <= ((ContextState *)pcVar13)->numFailedAssertions))
                      {
                        ((ContextState *)pcVar13)->subcasesHasSkipped = false;
                      }
                      iVar6 = iVar6 + iVar8;
                      (((ContextState *)pcVar13)->super_TestAccessibleContextState).
                      hasLoggedCurrentTestStart = false;
                    } while (((ContextState *)pcVar13)->subcasesHasSkipped != false);
                    local_51c = (local_51c + 1) - (uint)(iVar6 == 0);
                    if ((0 < iVar1) && (iVar1 <= ((ContextState *)pcVar13)->numFailedAssertions))
                    break;
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar7 = uVar7 + 1;
  }
  detail::Color::use((Color *)pcVar13,(local_51c == 0) + Red);
  puts("===============================================================================");
  pCVar12 = &col;
  detail::Color::~Color(pCVar12);
  pCVar10 = this->p;
  if ((pCVar10->count == false) &&
     ((pCVar10->list_test_cases == false && (pCVar10->list_test_suites != true)))) {
    detail::Color::use(pCVar12,Cyan);
    printf("%s","[doctest] ");
    detail::Color::~Color(&col);
    pCVar12 = &col;
    snprintf((char *)pCVar12,0x400,"test cases: %4d",(ulong)local_520);
    if (col != (Color)0x0) {
      detail::Color::use(pCVar12,None);
      printf("%s");
      pCVar12 = &col_6;
      detail::Color::~Color(pCVar12);
    }
    pCVar14 = &col;
    _col = (ContextState *)CONCAT44(uStack_434,0x207c20);
    detail::Color::use(pCVar12,None);
    printf("%s",pCVar14);
    detail::Color::~Color(&col_6);
    snprintf((char *)pCVar14,0x400,"%4d passed",(ulong)(local_520 - local_51c));
    if (col != (Color)0x0) {
      detail::Color::use(pCVar14,(uint)(local_51c == 0) * 3);
      printf("%s");
      pCVar14 = &col_6;
      detail::Color::~Color(pCVar14);
    }
    pCVar12 = &col;
    _col = (ContextState *)CONCAT44(uStack_434,0x207c20);
    detail::Color::use(pCVar14,None);
    printf("%s",pCVar12);
    detail::Color::~Color(&col_6);
    snprintf((char *)pCVar12,0x400,"%4d failed",(ulong)local_51c);
    if (col != (Color)0x0) {
      detail::Color::use(pCVar12,(uint)(local_51c != 0) * 2);
      printf("%s");
      pCVar12 = &col_6;
      detail::Color::~Color(pCVar12);
    }
    pCVar14 = &col;
    _col = (ContextState *)CONCAT44(uStack_434,0x207c20);
    detail::Color::use(pCVar12,None);
    printf("%s",pCVar14);
    detail::Color::~Color(&col_6);
    snprintf((char *)pCVar14,0x400,"%4d skipped\n",
             (ulong)((int)((ulong)((long)testArray.
                                         super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)testArray.
                                        super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) - local_520
                    ));
    if (col != (Color)0x0) {
      detail::Color::use(pCVar14,None);
      printf("%s",&col);
      pCVar14 = &col_6;
      detail::Color::~Color(pCVar14);
    }
    detail::Color::use(pCVar14,Cyan);
    printf("%s","[doctest] ");
    detail::Color::~Color(&col_6);
    pCVar12 = &col;
    snprintf((char *)pCVar12,0x400,"assertions: %4d",(ulong)(uint)this->p->numAssertions);
    if (col != (Color)0x0) {
      detail::Color::use(pCVar12,None);
      printf("%s");
      pCVar12 = &col_6;
      detail::Color::~Color(pCVar12);
    }
    pCVar14 = &col;
    _col = (ContextState *)CONCAT44(uStack_434,0x207c20);
    detail::Color::use(pCVar12,None);
    printf("%s",pCVar14);
    detail::Color::~Color(&col_6);
    snprintf((char *)pCVar14,0x400,"%4d passed",
             (ulong)(uint)(this->p->numAssertions - this->p->numFailedAssertions));
    if (col != (Color)0x0) {
      detail::Color::use(pCVar14,(uint)(local_51c == 0) * 3);
      printf("%s");
      pCVar14 = &col_6;
      detail::Color::~Color(pCVar14);
    }
    pCVar12 = &col;
    _col = (ContextState *)CONCAT44(uStack_434,0x207c20);
    detail::Color::use(pCVar14,None);
    printf("%s",pCVar12);
    detail::Color::~Color(&col_6);
    snprintf((char *)pCVar12,0x400,"%4d failed",(ulong)(uint)this->p->numFailedAssertions);
    if (col != (Color)0x0) {
      detail::Color::use(pCVar12,(uint)(0 < this->p->numFailedAssertions) * 2);
      printf("%s");
      pCVar12 = &col_6;
      detail::Color::~Color(pCVar12);
    }
    _col = (ContextState *)CONCAT44(uStack_434,0xa7c20);
    detail::Color::use(pCVar12,None);
    printf("%s",&col);
    detail::Color::~Color(&col_6);
  }
  else {
    detail::Color::use(pCVar12,Cyan);
    printf("%s","[doctest] ");
    detail::Color::~Color(&col);
    printf("number of tests passing the current filters: %d\n",(ulong)local_520);
  }
  iVar6 = 1;
  detail::getContextState::data = (ContextState *)0x0;
  if ((local_51c == 0) || (this->p->no_exitcode == true)) {
    iVar6 = 0;
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree(&testSuitesPassingFilters._M_t);
  std::
  _Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
  ::~_Vector_base(&testArray.
                   super__Vector_base<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                 );
  return iVar6;
}

Assistant:

int Context::run() {
    using namespace detail;

    getContextState() = p;
    p->resetRunData();

    // handle version, help and no_run
    if(p->no_run || p->version || p->help) {
        if(p->version)
            printVersion();
        if(p->help)
            printHelp();

        getContextState() = 0;

        return EXIT_SUCCESS;
    }

    printVersion();
    DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
    printf("run with \"--help\" for options\n");

    unsigned i = 0; // counter used for loops - here for VC6

    std::set<TestData>& registeredTests = getRegisteredTests();

    std::vector<const TestData*> testArray;
    for(std::set<TestData>::iterator it = registeredTests.begin(); it != registeredTests.end();
        ++it)
        testArray.push_back(&(*it));

    // sort the collected records
    if(testArray.size() > 0) {
        if(p->order_by.compare("file", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            srand(p->rand_seed);

            // random_shuffle implementation
            const TestData** first = &testArray[0];
            for(i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = rand() % (i + 1);

                const TestData* temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        }
    }

    if(p->list_test_cases) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("listing all test case names\n");
    }

    std::set<String> testSuitesPassingFilters;
    if(p->list_test_suites) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("listing all test suites\n");
    }

    unsigned numTestsPassingFilters = 0;
    unsigned numFailed              = 0;
    // invoke the registered functions if they match the filter criteria (or just count them)
    for(i = 0; i < testArray.size(); i++) {
        const TestData& data = *testArray[i];
        if(!matchesAny(data.m_file, p->filters[0], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_file, p->filters[1], 0, p->case_sensitive))
            continue;
        if(!matchesAny(data.m_suite, p->filters[2], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_suite, p->filters[3], 0, p->case_sensitive))
            continue;
        if(!matchesAny(data.m_name, p->filters[4], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_name, p->filters[5], 0, p->case_sensitive))
            continue;

        numTestsPassingFilters++;

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            printf("%s\n", data.m_name);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if(testSuitesPassingFilters.count(data.m_suite) == 0) {
                printf("%s\n", data.m_suite);
                testSuitesPassingFilters.insert(data.m_suite);
            }
            continue;
        }

        // skip the test if it is not in the execution range
        if((p->last < numTestsPassingFilters && p->first <= p->last) ||
           (p->first > numTestsPassingFilters))
            continue;

        // execute the test if it passes all the filtering
        {
#ifdef _MSC_VER
//__try {
#endif // _MSC_VER

            p->currentTest = &data;

            // if logging successful tests - force the start log
            p->hasLoggedCurrentTestStart = false;
            if(p->success)
                DOCTEST_LOG_START();

            unsigned didFail = 0;
            p->subcasesPassed.clear();
            do {
                // reset the assertion state
                p->numAssertionsForCurrentTestcase       = 0;
                p->numFailedAssertionsForCurrentTestcase = 0;

                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->subcasesHasSkipped   = false;
                p->subcasesCurrentLevel = 0;
                p->subcasesEnteredLevels.clear();

                // execute the test
                didFail += callTestFunc(data.m_f);
                p->numAssertions += p->numAssertionsForCurrentTestcase;

                // exit this loop if enough assertions have failed
                if(p->abort_after > 0 && p->numFailedAssertions >= p->abort_after)
                    p->subcasesHasSkipped = false;

                // if the start has been logged
                if(p->hasLoggedCurrentTestStart)
                    logTestEnd();
                p->hasLoggedCurrentTestStart = false;

            } while(p->subcasesHasSkipped == true);

            if(didFail > 0)
                numFailed++;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numFailedAssertions >= p->abort_after)
                break;

#ifdef _MSC_VER
//} __except(1) {
//    printf("Unknown SEH exception caught!\n");
//    numFailed++;
//}
#endif // _MSC_VER
        }
    }

    DOCTEST_PRINTF_COLORED(getSeparator(), numFailed > 0 ? Color::Red : Color::Green);
    if(p->count || p->list_test_cases || p->list_test_suites) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("number of tests passing the current filters: %d\n", numTestsPassingFilters);
    } else {
        char buff[DOCTEST_SNPRINTF_BUFFER_LENGTH];

        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "test cases: %4d", numTestsPassingFilters);
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d passed",
                         numTestsPassingFilters - numFailed);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::None : Color::Green);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d failed", numFailed);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::Red : Color::None);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d skipped\n",
                         static_cast<unsigned>(testArray.size()) - numTestsPassingFilters);
        DOCTEST_PRINTF_COLORED(buff, Color::None);

        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "assertions: %4d", p->numAssertions);
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d passed",
                         p->numAssertions - p->numFailedAssertions);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::None : Color::Green);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d failed", p->numFailedAssertions);
        DOCTEST_PRINTF_COLORED(buff, p->numFailedAssertions > 0 ? Color::Red : Color::None);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " |\n");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
    }

    // remove any coloring
    DOCTEST_PRINTF_COLORED("", Color::None);

    getContextState() = 0;

    if(numFailed && !p->no_exitcode)
        return EXIT_FAILURE;
    return EXIT_SUCCESS;
}